

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alternate_mutex.hpp
# Opt level: O2

void __thiscall yamc::alternate::recursive_timed_mutex::unlock(recursive_timed_mutex *this)

{
  pthread_t pVar1;
  pthread_t pVar2;
  size_t sVar3;
  
  std::mutex::lock(&this->mtx_);
  sVar3 = this->ncount_;
  if (sVar3 != 0) {
    pVar1 = (this->owner_)._M_thread;
    pVar2 = pthread_self();
    if (pVar1 == pVar2) {
      sVar3 = sVar3 - 1;
      this->ncount_ = sVar3;
      if (sVar3 == 0) {
        (this->owner_)._M_thread = 0;
        std::condition_variable::notify_one();
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->mtx_);
      return;
    }
  }
  __assert_fail("0 < ncount_ && owner_ == std::this_thread::get_id()",
                "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/include/alternate_mutex.hpp"
                ,0xfa,"void yamc::alternate::recursive_timed_mutex::unlock()");
}

Assistant:

void unlock()
  {
    std::lock_guard<decltype(mtx_)> lk(mtx_);
    assert(0 < ncount_ && owner_ == std::this_thread::get_id());
    if (--ncount_ == 0) {
      owner_ = std::thread::id();
      cv_.notify_one();
    }
  }